

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall
llvm::detail::IEEEFloat::makeNaN(IEEEFloat *this,bool SNaN,bool Negative,APInt *fill)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Significand *dst;
  uint uVar5;
  
  this->field_0x12 = (Negative << 3 | this->field_0x12 & 0xf0) + 1;
  uVar5 = this->semantics->precision;
  if (uVar5 - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  else {
    dst = &this->significand;
  }
  uVar5 = uVar5 + 0x40 >> 6;
  if ((fill == (APInt *)0x0) || ((uint)((ulong)fill->BitWidth + 0x3f >> 6) < uVar5)) {
    APInt::tcSet(&dst->part,0,uVar5);
  }
  if (fill != (APInt *)0x0) {
    puVar1 = &fill->BitWidth;
    if (0x40 < (ulong)*puVar1) {
      fill = (APInt *)(fill->U).pVal;
    }
    uVar3 = (uint)((ulong)*puVar1 + 0x3f >> 6);
    if (uVar5 < uVar3) {
      uVar3 = uVar5;
    }
    APInt::tcAssign(&dst->part,(WordType *)fill,uVar3);
    uVar4 = this->semantics->precision - 1;
    uVar3 = uVar4 >> 6;
    dst[uVar3].part = dst[uVar3].part & ~(-1L << ((byte)uVar4 & 0x3f));
    while (uVar3 = uVar3 + 1, uVar3 != uVar5) {
      dst[uVar3].part = 0;
    }
  }
  uVar4 = this->semantics->precision;
  uVar3 = uVar4 - 2;
  if (SNaN) {
    APInt::tcClearBit(&dst->part,uVar3);
    bVar2 = APInt::tcIsZero(&dst->part,uVar5);
    if (!bVar2) goto LAB_001b3ea4;
    uVar3 = uVar4 - 3;
  }
  APInt::tcSetBit(&dst->part,uVar3);
LAB_001b3ea4:
  if (this->semantics == (fltSemantics *)semX87DoubleExtended) {
    APInt::tcSetBit(&dst->part,uVar4 - 1);
    return;
  }
  return;
}

Assistant:

void IEEEFloat::makeNaN(bool SNaN, bool Negative, const APInt *fill) {
  category = fcNaN;
  sign = Negative;

  integerPart *significand = significandParts();
  unsigned numParts = partCount();

  // Set the significand bits to the fill.
  if (!fill || fill->getNumWords() < numParts)
    APInt::tcSet(significand, 0, numParts);
  if (fill) {
    APInt::tcAssign(significand, fill->getRawData(),
                    std::min(fill->getNumWords(), numParts));

    // Zero out the excess bits of the significand.
    unsigned bitsToPreserve = semantics->precision - 1;
    unsigned part = bitsToPreserve / 64;
    bitsToPreserve %= 64;
    significand[part] &= ((1ULL << bitsToPreserve) - 1);
    for (part++; part != numParts; ++part)
      significand[part] = 0;
  }

  unsigned QNaNBit = semantics->precision - 2;

  if (SNaN) {
    // We always have to clear the QNaN bit to make it an SNaN.
    APInt::tcClearBit(significand, QNaNBit);

    // If there are no bits set in the payload, we have to set
    // *something* to make it a NaN instead of an infinity;
    // conventionally, this is the next bit down from the QNaN bit.
    if (APInt::tcIsZero(significand, numParts))
      APInt::tcSetBit(significand, QNaNBit - 1);
  } else {
    // We always have to set the QNaN bit to make it a QNaN.
    APInt::tcSetBit(significand, QNaNBit);
  }

  // For x87 extended precision, we want to make a NaN, not a
  // pseudo-NaN.  Maybe we should expose the ability to make
  // pseudo-NaNs?
  if (semantics == &semX87DoubleExtended)
    APInt::tcSetBit(significand, QNaNBit + 1);
}